

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session.cpp
# Opt level: O3

void __thiscall session::dispatch(session *this)

{
  buffer *this_00;
  byte *pbVar1;
  int iVar2;
  byte *pbVar3;
  char *pcVar4;
  _func_int **pp_Var5;
  byte bVar6;
  uint uVar7;
  undefined8 uVar8;
  int count;
  imanager *piVar9;
  long lVar10;
  uint uVar11;
  
  if (this->closed_ == false) {
    this_00 = &this->recvbuf_;
    do {
      iVar2 = buffer::size(this_00);
      if (iVar2 < 1) break;
      pbVar3 = (byte *)buffer::data(this_00);
      iVar2 = buffer::size(this_00);
      if ((pbVar3 == (byte *)0x0) || (iVar2 < 1)) {
LAB_00107ad4:
        piVar9 = this->manager_;
        uVar11 = (this->super_iobject).netid_;
        pp_Var5 = piVar9->_vptr_imanager;
        uVar8 = 0x4a;
LAB_00107ae3:
        (*pp_Var5[1])(piVar9,(ulong)uVar11,uVar8);
        (*(this->network_->super_inetwork)._vptr_inetwork[5])
                  (this->network_,(ulong)(uint)(this->super_iobject).netid_);
        return;
      }
      uVar11 = (uint)*pbVar3;
      lVar10 = 1;
      if ((char)*pbVar3 < '\0') {
        lVar10 = 1;
        bVar6 = 0;
        uVar7 = 0;
        while ((uVar11 & 0x40) != 0) {
          if (lVar10 - (ulong)(iVar2 - 1) == 1) goto LAB_001079a8;
          pbVar1 = pbVar3 + lVar10;
          uVar7 = uVar7 << 6 | *pbVar1 & 0x3f;
          uVar11 = uVar11 * 2;
          lVar10 = lVar10 + 1;
          bVar6 = bVar6 + 5;
          if ((*pbVar1 & 0xffffffc0) != 0x80) goto LAB_00107ad4;
        }
        uVar11 = (uVar11 & 0x3f) << (bVar6 & 0x1f) | uVar7;
      }
      if (uVar11 - 0x800001 < 0xff800000) {
        piVar9 = this->manager_;
        uVar11 = (this->super_iobject).netid_;
        pp_Var5 = piVar9->_vptr_imanager;
        uVar8 = 0x5a;
        goto LAB_00107ae3;
      }
      count = (int)lVar10 + uVar11;
      buffer::reserve(this_00,count);
      iVar2 = buffer::size(this_00);
      if (iVar2 < count) break;
      buffer::pop_data(this_00,(int)lVar10);
      piVar9 = this->manager_;
      uVar7 = (this->super_iobject).netid_;
      pcVar4 = buffer::data(this_00);
      (*piVar9->_vptr_imanager[2])(piVar9,(ulong)uVar7,pcVar4);
      buffer::pop_data(this_00,uVar11);
    } while (this->closed_ != true);
  }
LAB_001079a8:
  buffer::trim_data(&this->recvbuf_);
  return;
}

Assistant:

void session::dispatch()
{
    while (!closed_ && recvbuf_.size() > 0)
    {
        int body_len = 0;
        int head_len = decode_head(&body_len, recvbuf_.data(), recvbuf_.size());
        if (head_len < 0)
        {
            on_error(EBADMSG);
            return;
        }

        if (head_len == 0)
        {
            break;
        }

        if (body_len <= 0 || body_len > max_buffer_size)
        {
            on_error(EMSGSIZE);
            return;
        }

        recvbuf_.reserve(head_len + body_len);
        if (recvbuf_.size() < head_len + body_len)
        {
            break;
        }

        recvbuf_.pop_data(head_len);
        manager_->on_package(netid_, recvbuf_.data(), body_len);
        recvbuf_.pop_data(body_len);
    }

    recvbuf_.trim_data();
}